

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

int byte_sequence_to_str(char *buffer,uint8_t *bytes,uint bytes_len,uint tabstops)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = tabstops;
  if (tabstops != 0) {
    do {
      buffer[0] = '\t';
      buffer[1] = '\0';
      buffer = buffer + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  if (bytes_len != 0) {
    uVar2 = 1;
    uVar6 = 0;
    do {
      iVar3 = sprintf(buffer,"%02X ",(ulong)bytes[uVar6]);
      buffer = buffer + iVar3;
      if ((uVar2 & 0xf) == 0) {
        pcVar5 = buffer + 1;
        buffer[0] = '\n';
        buffer[1] = '\0';
        buffer = pcVar5;
        uVar4 = tabstops;
        if (tabstops != 0) {
          do {
            pcVar5[0] = '\t';
            pcVar5[1] = '\0';
            buffer = pcVar5 + 1;
            uVar4 = uVar4 - 1;
            pcVar5 = buffer;
          } while (uVar4 != 0);
        }
      }
      uVar6 = uVar6 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar6 != bytes_len);
  }
  if ((bytes_len & 0xf) != 0) {
    buffer[0] = '\n';
    buffer[1] = '\0';
    buffer = buffer + 1;
  }
  buffer[0] = '\n';
  buffer[1] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int byte_sequence_to_str(char *buffer, uint8_t *bytes, unsigned int bytes_len, unsigned int tabstops)
{
	unsigned int bytes_printed = 1;

	for (unsigned int j = 0; j < tabstops; j++)
		buffer += sprintf(buffer, "\t");

	for (unsigned int i = 0; i < bytes_len; i++, bytes_printed++) {
		buffer += sprintf(buffer, "%02X ", bytes[i]);

		/* Only print 16 bytes in a single line. */
		if (bytes_printed % 16 == 0) {
			buffer += sprintf(buffer, "\n");
			for (unsigned int j = 0; j < tabstops; j++)
				buffer += sprintf(buffer, "\t");
		}
	}

	/* If there was no new line printed at the end of the for loop,
	 * print an extra new line.
	 */
	if (bytes_len % 16 != 0)
		buffer += sprintf(buffer, "\n");
	sprintf(buffer, "\n");
	return RTR_BGPSEC_SUCCESS;
}